

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

int Internal_compare_ngon_edges(void *a,void *b)

{
  uint *bi;
  uint *ai;
  
  if (*b <= *a) {
    if (*b < *a) {
      return 1;
    }
    if (*(uint *)((long)b + 4) <= *(uint *)((long)a + 4)) {
      return (int)(*(uint *)((long)b + 4) < *(uint *)((long)a + 4));
    }
  }
  return -1;
}

Assistant:

static int Internal_compare_ngon_edges(const void* a, const void* b)
{
  const unsigned int* ai = (const unsigned int*)a;
  const unsigned int* bi = (const unsigned int*)b;
  if (*ai < *bi)
    return -1;
  if (*ai > *bi)
    return 1;
  ai++;
  bi++;
  if (*ai < *bi)
    return -1;
  if (*ai > *bi)
    return 1;
  return 0;
}